

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# porting.c
# Opt level: O0

int uni_sem_wait(uni_sem_t *sem,uint timeout)

{
  uint timeout_local;
  uni_sem_t *sem_local;
  
  if ((sem == (uni_sem_t *)0x0) || (sem->hdl == (void *)0x0)) {
    sem_local._4_4_ = -2;
  }
  else if (timeout == 0xffffffff) {
    sem_wait((sem_t *)sem->hdl);
    sem_local._4_4_ = 0;
  }
  else {
    __sem_timedwait(sem->hdl,timeout);
    sem_local._4_4_ = 0;
  }
  return sem_local._4_4_;
}

Assistant:

int uni_sem_wait(uni_sem_t *sem, unsigned int timeout) {
    if (NULL_PTR_CHECK(sem) || NULL_PTR_CHECK(sem->hdl)) {
        return -INVALID_IN_PARAM;
    }

    if (timeout == UNI_WAIT_FOREVER) {
        sem_wait((sem_t *)sem->hdl);
        return OK;
    }

    __sem_timedwait((sem_t *)sem->hdl, timeout);
    return OK;
}